

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::loadperiodtoweighting(aalcalc *this)

{
  FILE *__stream;
  size_t sVar1;
  mapped_type *pmVar2;
  float fVar3;
  Periods p;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar1 = fread(&p,0xc,1,__stream);
    while (sVar1 != 0) {
      fVar3 = (float)p.weighting;
      pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](&this->periodstoweighting_,&p.period_no);
      *pmVar2 = (double)fVar3;
      sVar1 = fread(&p,0xc,1,__stream);
    }
  }
  return;
}

Assistant:

void aalcalc::loadperiodtoweighting()
{
	FILE *fin = fopen(PERIODS_FILE, "rb");
	if (fin == NULL) return;

	Periods p;
	size_t i = fread(&p, sizeof(Periods), 1, fin);
	while (i != 0) {
		periodstoweighting_[p.period_no] = (OASIS_FLOAT)p.weighting;		
		i = fread(&p, sizeof(Periods), 1, fin);
	}

}